

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O2

void __thiscall xmrig::Config::getJSON(Config *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  undefined1 auStack_178 [16];
  Value api;
  StringRefType local_150;
  StringRefType local_140;
  StringRefType local_130;
  StringRefType local_120;
  StringRefType local_110;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  StringRefType local_30;
  
  (doc->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.n = (Number)0x0;
  (doc->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.s.str = (Ch *)0x0;
  (doc->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.f.flags = 3;
  allocator = doc->allocator_;
  api.data_.n = (Number)0x0;
  api.data_.s.str = (Ch *)0x3000000000000;
  local_d0.s = "id";
  local_d0.length = 2;
  String::toJSON((String *)auStack_178);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&api,&local_d0,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)auStack_178,allocator);
  local_e0.s = "worker-id";
  local_e0.length = 9;
  String::toJSON((String *)auStack_178);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&api,&local_e0,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)auStack_178,allocator);
  local_30.s = "api";
  local_30.length = 3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_30,&api,allocator);
  local_f0.s = "http";
  local_f0.length = 4;
  Http::toJSON((Http *)auStack_178,(Document *)&(this->super_BaseConfig).m_http);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_f0,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)auStack_178,allocator);
  local_40.s = "autosave";
  local_40.length = 8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(&doc->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,&local_40,(this->super_BaseConfig).m_autoSave,allocator);
  local_50.s = "background";
  local_50.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(&doc->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,&local_50,(this->super_BaseConfig).m_background,allocator);
  local_60.s = "colors";
  local_60.length = 6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(&doc->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,&local_60,(bool)Log::colors,allocator);
  local_100.s = "cpu";
  local_100.length = 3;
  CpuConfig::toJSON((CpuConfig *)auStack_178,(Document *)this->d_ptr);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_100,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)auStack_178,allocator);
  local_110.s = "opencl";
  local_110.length = 6;
  OclConfig::toJSON((OclConfig *)auStack_178,(Document *)&this->d_ptr->cl);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_110,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)auStack_178,allocator);
  local_120.s = "cuda";
  local_120.length = 4;
  CudaConfig::toJSON((CudaConfig *)auStack_178,(Document *)&this->d_ptr->cuda);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_120,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)auStack_178,allocator);
  local_130.s = "log-file";
  local_130.length = 8;
  String::toJSON((String *)auStack_178);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_130,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)auStack_178,allocator);
  local_140.s = "pools";
  local_140.length = 5;
  Pools::toJSON((Pools *)auStack_178,(Document *)&(this->super_BaseConfig).m_pools);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_140,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)auStack_178,allocator);
  local_70.s = "print-time";
  local_70.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            (&doc->
              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ,&local_70,(this->super_BaseConfig).m_printTime,allocator);
  local_80.s = "health-print-time";
  local_80.length = 0x11;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            (&doc->
              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ,&local_80,this->d_ptr->healthPrintTime,allocator);
  local_90.s = "retries";
  local_90.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(&doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ,&local_90,(this->super_BaseConfig).m_pools.m_retries,allocator);
  local_a0.s = "retry-pause";
  local_a0.length = 0xb;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(&doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ,&local_a0,(this->super_BaseConfig).m_pools.m_retryPause,allocator);
  local_b0.s = "syslog";
  local_b0.length = 6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(&doc->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,&local_b0,(this->super_BaseConfig).m_syslog,allocator);
  local_150.s = "user-agent";
  local_150.length = 10;
  String::toJSON((String *)auStack_178);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_150,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)auStack_178,allocator);
  local_c0.s = "watch";
  local_c0.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(&doc->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,&local_c0,(this->super_BaseConfig).m_watch,allocator);
  return;
}

Assistant:

void xmrig::Config::getJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;

    doc.SetObject();

    auto &allocator = doc.GetAllocator();

    Value api(kObjectType);
    api.AddMember("id",                m_apiId.toJSON(), allocator);
    api.AddMember("worker-id",         m_apiWorkerId.toJSON(), allocator);

    doc.AddMember("api",               api, allocator);
    doc.AddMember("http",              m_http.toJSON(doc), allocator);
    doc.AddMember("autosave",          isAutoSave(), allocator);
    doc.AddMember("background",        isBackground(), allocator);
    doc.AddMember("colors",            Log::colors, allocator);

    doc.AddMember(StringRef(kCPU),     cpu().toJSON(doc), allocator);

#   ifdef XMRIG_FEATURE_OPENCL
    doc.AddMember(StringRef(kOcl),     cl().toJSON(doc), allocator);
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    doc.AddMember(StringRef(kCuda),    cuda().toJSON(doc), allocator);
#   endif

    doc.AddMember("log-file",                   m_logFile.toJSON(), allocator);
    doc.AddMember("pools",                      m_pools.toJSON(doc), allocator);
    doc.AddMember("print-time",                 printTime(), allocator);
#   if defined(XMRIG_FEATURE_NVML)
    doc.AddMember(StringRef(kHealthPrintTime),  healthPrintTime(), allocator);
#   endif
    doc.AddMember("retries",                    m_pools.retries(), allocator);
    doc.AddMember("retry-pause",                m_pools.retryPause(), allocator);
    doc.AddMember("syslog",                     isSyslog(), allocator);
    doc.AddMember("user-agent",                 m_userAgent.toJSON(), allocator);
    doc.AddMember("watch",                      m_watch, allocator);
}